

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeImageType
          (Builder *this,Id sampledType,Dim dim,bool depth,bool arrayed,bool ms,uint sampled,
          ImageFormat format)

{
  pointer *pppIVar1;
  Vector<Id> *this_00;
  pointer ppIVar2;
  Id *pIVar3;
  iterator __position;
  undefined4 uVar4;
  Builder *pBVar5;
  Id IVar6;
  Instruction *pIVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  pointer *__ptr;
  byte bVar12;
  iterator iVar13;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  Instruction *local_50;
  uint local_48;
  undefined4 local_44;
  undefined4 local_40;
  uint local_3c;
  Builder *local_38;
  
  local_44 = CONCAT31(in_register_00000089,ms);
  local_40 = CONCAT31(in_register_00000081,arrayed);
  if (1 < sampled - 1) {
    __assert_fail("sampled == 1 || sampled == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x1de,
                  "Id spv::Builder::makeImageType(Id, Dim, bool, bool, bool, unsigned int, ImageFormat)"
                 );
  }
  ppIVar2 = this->groupedTypes[0x19].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3c = (uint)arrayed;
  local_48 = (uint)ms;
  uVar10 = (uint)((ulong)((long)this->groupedTypes[0x19].
                                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  uVar11 = (uint)depth;
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      local_50 = ppIVar2[uVar9];
      pIVar3 = (local_50->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((((*pIVar3 == sampledType) && (pIVar3[1] == dim)) && (pIVar3[2] == uVar11)) &&
         (((pIVar3[3] == local_3c && (pIVar3[4] == local_48)) &&
          ((pIVar3[5] == sampled && (pIVar3[6] == format)))))) goto LAB_001b265f;
      uVar9 = uVar9 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar9);
  }
  pIVar7 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar6 = this->uniqueId + 1;
  this->uniqueId = IVar6;
  pIVar7->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar7->resultId = IVar6;
  pIVar7->typeId = 0;
  pIVar7->opCode = OpTypeImage;
  this_00 = &pIVar7->operands;
  (pIVar7->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar7->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar7->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar7->block = (Block *)0x0;
  local_50 = pIVar7;
  local_38 = this;
  local_58._M_head_impl._0_4_ = sampledType;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
             (iterator)0x0,(uint *)&local_58);
  iVar13._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar8 = (pIVar7->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar13._M_current == puVar8) {
    local_58._M_head_impl._0_4_ = dim;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar13,
               (uint *)&local_58);
    iVar13._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (pIVar7->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar13._M_current = dim;
    iVar13._M_current = iVar13._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current;
  }
  if (iVar13._M_current == puVar8) {
    local_58._M_head_impl._0_4_ = uVar11;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar13,
               (uint *)&local_58);
    iVar13._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (local_50->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pIVar7 = local_50;
  }
  else {
    *iVar13._M_current = uVar11;
    iVar13._M_current = iVar13._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current;
  }
  pBVar5 = local_38;
  uVar4 = local_40;
  local_58._M_head_impl._0_4_ = local_3c;
  if (iVar13._M_current == puVar8) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar13,(uint *)&local_58);
    iVar13._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (local_50->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pIVar7 = local_50;
  }
  else {
    *iVar13._M_current = local_3c;
    iVar13._M_current = iVar13._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current;
  }
  if (iVar13._M_current == puVar8) {
    local_58._M_head_impl._0_4_ = local_48;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar13,(uint *)&local_58);
    iVar13._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (local_50->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pIVar7 = local_50;
  }
  else {
    *iVar13._M_current = local_48;
    iVar13._M_current = iVar13._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current;
  }
  local_58._M_head_impl._0_4_ = sampled;
  if (iVar13._M_current == puVar8) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar13,(uint *)&local_58);
    iVar13._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar8 = (local_50->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pIVar7 = local_50;
  }
  else {
    *iVar13._M_current = sampled;
    iVar13._M_current = iVar13._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current;
  }
  local_58._M_head_impl._0_4_ = format;
  if (iVar13._M_current == puVar8) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar13,(uint *)&local_58);
  }
  else {
    *iVar13._M_current = format;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar13._M_current + 1;
  }
  __position._M_current =
       pBVar5->groupedTypes[0x19].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      pBVar5->groupedTypes[0x19].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (pBVar5->groupedTypes + 0x19),__position,&local_50);
  }
  else {
    *__position._M_current = local_50;
    pppIVar1 = &pBVar5->groupedTypes[0x19].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  local_58._M_head_impl = local_50;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar5->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58);
  if (local_58._M_head_impl != (Instruction *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&pBVar5->module,local_50);
  bVar12 = (byte)uVar4;
  switch(dim) {
  case Dim1D:
    if (sampled != 1) {
      local_58._M_head_impl._0_4_ = 0x2c;
LAB_001b2611:
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar5->capabilities,(Capability *)&local_58);
      goto switchD_001b255a_caseD_1;
    }
    local_58._M_head_impl._0_4_ = 0x2b;
    break;
  default:
switchD_001b255a_caseD_1:
    if (((byte)local_44 & sampled == 2) == 0) goto LAB_001b265f;
    if (dim != DimSubpassData) {
      local_58._M_head_impl._0_4_ = 0x1b;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar5->capabilities,(Capability *)&local_58);
    }
    goto joined_r0x001b25ef;
  case DimCube:
    if (bVar12 == 0) goto switchD_001b255a_caseD_1;
    if (sampled != 1) {
      local_58._M_head_impl._0_4_ = 0x22;
      goto LAB_001b2611;
    }
    local_58._M_head_impl._0_4_ = 0x2d;
    break;
  case DimRect:
    if (sampled != 1) {
      local_58._M_head_impl._0_4_ = 0x24;
      goto LAB_001b2611;
    }
    local_58._M_head_impl._0_4_ = 0x25;
    break;
  case DimBuffer:
    if (sampled != 1) {
      local_58._M_head_impl._0_4_ = 0x2f;
      goto LAB_001b2611;
    }
    local_58._M_head_impl._0_4_ = 0x2e;
    break;
  case DimSubpassData:
    local_58._M_head_impl._0_4_ = 0x28;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar5->capabilities,(Capability *)&local_58);
    bVar12 = sampled == 2 & (byte)local_44 & bVar12;
joined_r0x001b25ef:
    if (bVar12 == 0) goto LAB_001b265f;
    local_58._M_head_impl._4_4_ = (undefined4)((ulong)local_58._M_head_impl >> 0x20);
    local_58._M_head_impl._0_4_ = 0x30;
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar5->capabilities,(Capability *)&local_58);
LAB_001b265f:
  return local_50->resultId;
}

Assistant:

Id Builder::makeImageType(Id sampledType, Dim dim, bool depth, bool arrayed, bool ms, unsigned sampled, ImageFormat format)
{
    assert(sampled == 1 || sampled == 2);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeImage].size(); ++t) {
        type = groupedTypes[OpTypeImage][t];
        if (type->getIdOperand(0) == sampledType &&
            type->getImmediateOperand(1) == (unsigned int)dim &&
            type->getImmediateOperand(2) == (  depth ? 1u : 0u) &&
            type->getImmediateOperand(3) == (arrayed ? 1u : 0u) &&
            type->getImmediateOperand(4) == (     ms ? 1u : 0u) &&
            type->getImmediateOperand(5) == sampled &&
            type->getImmediateOperand(6) == (unsigned int)format)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeImage);
    type->addIdOperand(sampledType);
    type->addImmediateOperand(   dim);
    type->addImmediateOperand(  depth ? 1 : 0);
    type->addImmediateOperand(arrayed ? 1 : 0);
    type->addImmediateOperand(     ms ? 1 : 0);
    type->addImmediateOperand(sampled);
    type->addImmediateOperand((unsigned int)format);

    groupedTypes[OpTypeImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (dim) {
    case DimBuffer:
        if (sampled == 1)
            addCapability(CapabilitySampledBuffer);
        else
            addCapability(CapabilityImageBuffer);
        break;
    case Dim1D:
        if (sampled == 1)
            addCapability(CapabilitySampled1D);
        else
            addCapability(CapabilityImage1D);
        break;
    case DimCube:
        if (arrayed) {
            if (sampled == 1)
                addCapability(CapabilitySampledCubeArray);
            else
                addCapability(CapabilityImageCubeArray);
        }
        break;
    case DimRect:
        if (sampled == 1)
            addCapability(CapabilitySampledRect);
        else
            addCapability(CapabilityImageRect);
        break;
    case DimSubpassData:
        addCapability(CapabilityInputAttachment);
        break;
    default:
        break;
    }

    if (ms) {
        if (sampled == 2) {
            // Images used with subpass data are not storage
            // images, so don't require the capability for them.
            if (dim != Dim::DimSubpassData)
                addCapability(CapabilityStorageImageMultisample);
            if (arrayed)
                addCapability(CapabilityImageMSArray);
        }
    }

    return type->getResultId();
}